

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uncertain_measurements.cpp
# Opt level: O3

void __thiscall
uncertainOps_example1_Test::~uncertainOps_example1_Test(uncertainOps_example1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(uncertainOps, example1)
{
    uncertain_measurement x1(9.3, 0.2, m);
    uncertain_measurement x2(14.4, 0.3, m);

    auto z = x2 - x1;
    EXPECT_NEAR(z.value(), 5.1, 0.05);
    EXPECT_NEAR(z.uncertainty(), 0.36, 0.005);

    auto zs = x2.simple_subtract(x1);
    EXPECT_NEAR(zs.value(), 5.1, 0.05);
}